

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

void base_extent_bump_alloc_post
               (base_t *base,extent_t *extent,size_t gap_size,void *addr,size_t size)

{
  size_t sVar1;
  uint uVar2;
  
  sVar1 = (extent->field_2).e_size_esn;
  if (sVar1 != 0) {
    if (sVar1 + 1 < 0x1001) {
      uVar2 = (uint)sz_size2index_tab[sVar1 + 8 >> 3];
    }
    else {
      uVar2 = sz_size2index_compute(sVar1 + 1);
    }
    extent_heap_insert(base->avail + (uVar2 - 1),extent);
  }
  base->allocated = base->allocated + size;
  base->resident =
       base->resident +
       (((long)addr + size + 0xfff & 0xfffffffffffff000) -
       ((long)addr + (0xfff - gap_size) & 0xfffffffffffff000));
  if (((opt_metadata_thp != metadata_thp_disabled) && (init_system_thp_mode == thp_mode_default)) &&
     ((opt_metadata_thp == metadata_thp_always || (base->auto_thp_switched == true)))) {
    base->n_thp = base->n_thp +
                  ((long)addr +
                   (size - ((long)addr + (0x1fffff - gap_size) & 0xffffffffffe00000)) + 0x1fffff >>
                  0x15);
  }
  return;
}

Assistant:

static void
base_extent_bump_alloc_post(base_t *base, extent_t *extent, size_t gap_size,
    void *addr, size_t size) {
	if (extent_bsize_get(extent) > 0) {
		/*
		 * Compute the index for the largest size class that does not
		 * exceed extent's size.
		 */
		szind_t index_floor =
		    sz_size2index(extent_bsize_get(extent) + 1) - 1;
		extent_heap_insert(&base->avail[index_floor], extent);
	}

	if (config_stats) {
		base->allocated += size;
		/*
		 * Add one PAGE to base_resident for every page boundary that is
		 * crossed by the new allocation. Adjust n_thp similarly when
		 * metadata_thp is enabled.
		 */
		base->resident += PAGE_CEILING((uintptr_t)addr + size) -
		    PAGE_CEILING((uintptr_t)addr - gap_size);
		assert(base->allocated <= base->resident);
		assert(base->resident <= base->mapped);
		if (metadata_thp_madvise() && (opt_metadata_thp ==
		    metadata_thp_always || base->auto_thp_switched)) {
			base->n_thp += (HUGEPAGE_CEILING((uintptr_t)addr + size)
			    - HUGEPAGE_CEILING((uintptr_t)addr - gap_size)) >>
			    LG_HUGEPAGE;
			assert(base->mapped >= base->n_thp << LG_HUGEPAGE);
		}
	}
}